

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_13a68a::ChorusState::deviceUpdate(ChorusState *this,ALCdevice *Device)

{
  undefined8 *puVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  uint uVar5;
  long lVar6;
  size_type __n;
  allocator_type local_29;
  vector<float,_al::allocator<float,_16UL>_> local_28;
  
  uVar5 = (uint)((float)Device->Frequency * 0.032);
  if (uVar5 == 0xffffffff) {
    __n = 1;
  }
  else {
    uVar5 = uVar5 >> 1 | uVar5;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    __n = (size_type)((uVar5 >> 0x10 | uVar5) + 1);
  }
  if ((long)(this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 != __n) {
    std::vector<float,_al::allocator<float,_16UL>_>::vector(&local_28,__n,&local_29);
    pfVar2 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar4 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar2;
    local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar3;
    local_28.super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pfVar4;
    if (pfVar2 != (pointer)0x0) {
      al_free(pfVar2);
    }
  }
  pfVar2 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar2 != pfVar3) {
    memset(pfVar2,0,((long)pfVar3 + (-4 - (long)pfVar2) & 0xfffffffffffffffcU) + 4);
  }
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)this->mGains[0].Current + lVar6 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Current + lVar6 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Current + lVar6 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Current + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Target + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Target + lVar6 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Target + lVar6 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mGains[0].Target + lVar6 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar6 = lVar6 + 0x80;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

void ChorusState::deviceUpdate(const ALCdevice *Device)
{
    constexpr float max_delay{maxf(AL_CHORUS_MAX_DELAY, AL_FLANGER_MAX_DELAY)};

    const auto frequency = static_cast<float>(Device->Frequency);
    const size_t maxlen{NextPowerOf2(float2uint(max_delay*2.0f*frequency) + 1u)};
    if(maxlen != mSampleBuffer.size())
        al::vector<float,16>(maxlen).swap(mSampleBuffer);

    std::fill(mSampleBuffer.begin(), mSampleBuffer.end(), 0.0f);
    for(auto &e : mGains)
    {
        std::fill(std::begin(e.Current), std::end(e.Current), 0.0f);
        std::fill(std::begin(e.Target), std::end(e.Target), 0.0f);
    }
}